

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O3

ErrorMsgStream * __thiscall
spvtools::utils::(anonymous_namespace)::ErrorMsgStream::operator<<(ErrorMsgStream *this,char *val)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = *(ostream **)this;
  if (poVar1 != (ostream *)0x0) {
    if (val == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar2 = strlen(val);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,val,sVar2);
    }
  }
  return (ErrorMsgStream *)this;
}

Assistant:

ErrorMsgStream& operator<<(T val) {
    if (stream_) *stream_ << val;
    return *this;
  }